

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SizeRange::SerializeWithCachedSizes
          (SizeRange *this,CodedOutputStream *output)

{
  if (this->lowerbound_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->lowerbound_,output);
  }
  if (this->upperbound_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(2,this->upperbound_,output);
    return;
  }
  return;
}

Assistant:

void SizeRange::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SizeRange)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 lowerBound = 1;
  if (this->lowerbound() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->lowerbound(), output);
  }

  // int64 upperBound = 2;
  if (this->upperbound() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->upperbound(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SizeRange)
}